

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O0

void PrintHeader(sunrealtype rtol,sunrealtype atol,N_Vector y)

{
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  printf("\nidaSlCrank_dns: Slider-Crank DAE serial example problem for IDA\n");
  printf("Linear solver: DENSE, Jacobian is computed by IDA.\n");
  printf("Tolerance parameters:  rtol = %g   atol = %g\n",in_XMM0_Qa,in_XMM1_Qa);
  printf("-----------------------------------------------------------------------\n");
  printf("  t            y1          y2           y3");
  printf("      | nst  k      h\n");
  printf("-----------------------------------------------------------------------\n");
  return;
}

Assistant:

static void PrintHeader(sunrealtype rtol, sunrealtype atol, N_Vector y)
{
  printf("\nidaSlCrank_dns: Slider-Crank DAE serial example problem for IDA\n");
  printf("Linear solver: DENSE, Jacobian is computed by IDA.\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters:  rtol = %Lg   atol = %Lg\n", rtol, atol);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#else
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#endif
  printf("---------------------------------------------------------------------"
         "--\n");
  printf("  t            y1          y2           y3");
  printf("      | nst  k      h\n");
  printf("---------------------------------------------------------------------"
         "--\n");
}